

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipkinCollector.cpp
# Opt level: O3

ssize_t __thiscall
twitter::zipkin::thrift::ZipkinCollector_submitZipkinBatch_presult::read
          (ZipkinCollector_submitZipkinBatch_presult *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
  *pvVar1;
  pointer pRVar2;
  pointer pRVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  long lVar8;
  pointer pRVar9;
  uint32_t _size36;
  int16_t fid;
  TType ftype;
  string fname;
  TType _etype39;
  uint local_6c;
  short local_66;
  int local_64;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  pointer local_40;
  undefined1 local_34 [4];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = 0;
  iVar4 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_60);
  do {
    iVar5 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_60,&local_64,&local_66);
    iVar5 = iVar5 + iVar4;
    if (local_64 == 0) {
      iVar4 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar5);
    }
    if (local_66 == 0) {
      if (local_64 != 0xf) {
        iVar6 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
        goto LAB_00207a49;
      }
      pvVar1 = this->success;
      pRVar9 = (pvVar1->
               super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pRVar2 = (pvVar1->
               super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pRVar3 = pRVar9;
      if (pRVar2 != pRVar9) {
        do {
          local_40 = pRVar3;
          (*(code *)**(undefined8 **)pRVar9)(pRVar9);
          pRVar9 = pRVar9 + 1;
          pRVar3 = local_40;
        } while (pRVar9 != pRVar2);
        (pvVar1->
        super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
        )._M_impl.super__Vector_impl_data._M_finish = local_40;
      }
      iVar4 = (*this_00->_vptr_TProtocol[0x1f])(this_00,local_34,&local_6c);
      std::
      vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
      ::resize(this->success,(ulong)local_6c);
      iVar4 = iVar4 + iVar5;
      if (local_6c != 0) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          pRVar9 = (this->success->
                   super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar5 = (**(code **)(*(long *)(&pRVar9->field_0x0 + lVar8) + 0x10))
                            (&pRVar9->field_0x0 + lVar8,this_00);
          iVar4 = iVar4 + iVar5;
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x10;
        } while (uVar7 < local_6c);
      }
      iVar6 = (*this_00->_vptr_TProtocol[0x20])(this_00);
      iVar6 = iVar6 + iVar4;
      this->__isset = (_ZipkinCollector_submitZipkinBatch_presult__isset)((byte)this->__isset | 1);
    }
    else {
      iVar6 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
LAB_00207a49:
      iVar6 = iVar6 + iVar5;
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar4 = iVar4 + iVar6;
  } while( true );
}

Assistant:

uint32_t ZipkinCollector_submitZipkinBatch_presult::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 0:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            (*(this->success)).clear();
            uint32_t _size36;
            ::apache::thrift::protocol::TType _etype39;
            xfer += iprot->readListBegin(_etype39, _size36);
            (*(this->success)).resize(_size36);
            uint32_t _i40;
            for (_i40 = 0; _i40 < _size36; ++_i40)
            {
              xfer += (*(this->success))[_i40].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.success = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}